

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_playing_effects(IT_PLAYING *playing)

{
  undefined1 uVar1;
  long lVar2;
  char cVar3;
  long in_RDI;
  IT_PLAYING *unaff_retaddr;
  IT_CHANNEL *channel;
  
  lVar2 = *(long *)(in_RDI + 8);
  if (*(char *)(lVar2 + 0xd) != '\0') {
    *(undefined1 *)(in_RDI + 0x44) = *(undefined1 *)(lVar2 + 0xc);
  }
  if (*(char *)(lVar2 + 0x58) == '\0') {
    if (((*(char *)(lVar2 + 0x56) != '\0') &&
        (cVar3 = *(char *)(lVar2 + 0x54) + -1, *(char *)(lVar2 + 0x54) = cVar3, cVar3 == '\0')) &&
       (*(undefined1 *)(lVar2 + 0x54) = *(undefined1 *)(lVar2 + 0x56), in_RDI != 0)) {
      *(char *)(in_RDI + 0x4a) = *(char *)(in_RDI + 0x4a) + (char)*(undefined4 *)(lVar2 + 0x50);
      if (0x77 < *(byte *)(in_RDI + 0x4a)) {
        if (*(int *)(lVar2 + 0x50) < 0) {
          *(undefined1 *)(in_RDI + 0x4a) = 0;
        }
        else {
          *(undefined1 *)(in_RDI + 0x4a) = 0x77;
        }
      }
      if (*(long *)(lVar2 + 0x88) == in_RDI) {
        uVar1 = *(undefined1 *)(in_RDI + 0x4a);
        *(undefined1 *)(lVar2 + 0x5e) = uVar1;
        *(undefined1 *)(lVar2 + 0xf) = uVar1;
      }
      if (*(char *)(lVar2 + 0x5a) != '\0') {
        it_playing_reset_resamplers(unaff_retaddr,(int32)((ulong)in_RDI >> 0x20));
        *(undefined1 *)(in_RDI + 0x2b) = 0;
      }
    }
  }
  else {
    cVar3 = *(char *)(lVar2 + 0x58);
    *(char *)(lVar2 + 0x58) = cVar3 + -1;
    if ((cVar3 != '\0') &&
       (*(char *)(in_RDI + 0x4a) = *(char *)(in_RDI + 0x4a) + (char)*(undefined4 *)(lVar2 + 0x50),
       0x77 < *(byte *)(in_RDI + 0x4a))) {
      if (*(int *)(lVar2 + 0x50) < 0) {
        *(undefined1 *)(in_RDI + 0x4a) = 0;
      }
      else {
        *(undefined1 *)(in_RDI + 0x4a) = 0x77;
      }
    }
  }
  return;
}

Assistant:

static void update_playing_effects(IT_PLAYING *playing)
{
	IT_CHANNEL *channel = playing->channel;

	if (channel->channelvolslide) {
		playing->channel_volume = channel->channelvolume;
	}

	if (channel->okt_toneslide) {
		if (channel->okt_toneslide--) {
			playing->note += channel->toneslide;
			if (playing->note >= 120) {
				if (channel->toneslide < 0) playing->note = 0;
				else playing->note = 119;
			}
		}
	} else if (channel->ptm_toneslide) {
		if (--channel->toneslide_tick == 0) {
			channel->toneslide_tick = channel->ptm_toneslide;
			if (playing) {
				playing->note += channel->toneslide;
				if (playing->note >= 120) {
					if (channel->toneslide < 0) playing->note = 0;
					else playing->note = 119;
				}
				if (channel->playing == playing) {
					channel->note = channel->truenote = playing->note;
				}
				if (channel->toneslide_retrig) {
					it_playing_reset_resamplers(playing, 0);
					playing->declick_stage = 0;
				}
			}
		}
	}
}